

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  FILE *__stream;
  int iVar4;
  dir_tree_t *trees_00;
  int *piVar5;
  char *pcVar6;
  int local_d8;
  int update;
  int force;
  int k;
  int j;
  int i;
  int needwrite;
  stat zipstat;
  file_entry_t *file;
  dir_tree_t *trees;
  dir_tree_t *tree;
  char **argv_local;
  int argc_local;
  
  bVar2 = false;
  local_d8 = 0;
  update = 1;
  for (k = 1; k < argc; k = k + 1) {
    if (*argv[k] == '-') {
      if ((argv[k][1] == '-') && (argv[k][2] == '\0')) break;
      for (force = 1; argv[k][force] != '\0'; force = force + 1) {
        if (argv[k][force] == 'f') {
          bVar2 = true;
        }
        else if (argv[k][force] == 'd') {
          DeflateOnly = 1;
        }
        else if (argv[k][force] == 'u') {
          local_d8 = 1;
        }
        else {
          if (argv[k][force] != 'q') {
            fprintf(_stderr,"Unknown option \'%c\'\n",(ulong)(uint)(int)argv[k][force]);
            print_usage(*argv);
            return 1;
          }
          Quiet = 1;
        }
      }
    }
    else {
      argv[update] = argv[k];
      update = update + 1;
    }
  }
  for (; k <= argc; k = k + 1) {
    argv[update] = argv[k];
    update = update + 1;
  }
  if (argc - (k - update) < 3) {
    print_usage(*argv);
    argv_local._4_4_ = 1;
  }
  else {
    trees_00 = add_dirs(argv + 2);
    if (no_mem == 0) {
      iVar4 = stat(argv[1],(stat *)&i);
      bVar3 = bVar2;
      if (iVar4 == 0) {
        trees = trees_00;
        if (!bVar2) {
          for (; trees != (dir_tree_t *)0x0; trees = trees->next) {
            for (zipstat.__glibc_reserved[2] = (__syscall_slong_t)trees->files;
                zipstat.__glibc_reserved[2] != 0;
                zipstat.__glibc_reserved[2] = *(__syscall_slong_t *)zipstat.__glibc_reserved[2]) {
              if (zipstat.st_atim.tv_nsec < *(long *)(zipstat.__glibc_reserved[2] + 8)) {
                bVar3 = true;
                break;
              }
            }
          }
        }
      }
      else {
        piVar5 = __errno_location();
        __stream = _stderr;
        if (*piVar5 == 2) {
          local_d8 = 0;
          bVar3 = true;
        }
        else {
          pcVar1 = argv[1];
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          fprintf(__stream,"Could not stat %s: %s\n",pcVar1,pcVar6);
        }
      }
      if ((bVar2) || (bVar3)) {
        write_zip(argv[1],trees_00,local_d8);
      }
      free_dir_trees(trees_00);
      if (no_mem == 0) {
        argv_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"Out of memory.\n");
        argv_local._4_4_ = 1;
      }
    }
    else {
      free_dir_trees(trees_00);
      fprintf(_stderr,"Out of memory.\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char **argv)
{
	dir_tree_t *tree, *trees;
	file_entry_t *file;
	struct stat zipstat;
	int needwrite;
	int i, j, k;
	int force = 0;
	int update = 0;

	// Find options. Options are removed from the array.
	for (i = k = 1; i < argc; ++i)
	{
		if (argv[i][0] == '-')
		{
			if (argv[i][1] == '-')
			{
				if (argv[i][2] == '\0')
				{ // -- terminates option handling for the rest of the command line
					break;
				}
			}
			for (j = 1; argv[i][j] != '\0'; ++j)
			{
				if (argv[i][j] == 'f')
				{
					force = 1;
				}
				else if (argv[i][j] == 'd')
				{
					DeflateOnly = 1;
				}
				else if (argv[i][j] == 'u')
				{
					update = 1;
				}
				else if (argv[i][j] == 'q')
				{
					Quiet = 1;
				}
				else
				{
					fprintf(stderr, "Unknown option '%c'\n", argv[i][j]);
					print_usage(argv[0]);
					return 1;
				}
			}
		}
		else
		{
			argv[k++] = argv[i];
		}
	}
	for (; i <= argc; ++i)
	{
		argv[k++] = argv[i];
	}
	argc -= i - k;

	if (argc < 3)
	{
		print_usage(argv[0]);
		return 1;
	}

	trees = add_dirs(&argv[2]);
	if (no_mem)
	{
		free_dir_trees(trees);
		fprintf(stderr, "Out of memory.\n");
		return 1;
	}

	needwrite = force;
	if (stat(argv[1], &zipstat) != 0)
	{
		if (errno == ENOENT)
		{
			needwrite = 1;
			update = 0;		// Can't update what's not there.
		}
		else
		{
			fprintf(stderr, "Could not stat %s: %s\n", argv[1], strerror(errno));
		}
	}
	else if (!needwrite)
	{
		// Check the files in each tree. If any one of them was modified more
		// recently than the zip, then it needs to be recreated.
		for (tree = trees; tree != NULL; tree = tree->next)
		{
			for (file = tree->files; file != NULL; file = file->next)
			{
				if (file->time_write > zipstat.st_mtime)
				{
					needwrite = 1;
					break;
				}
			}
		}
	}
	if (force || needwrite)
	{
		write_zip(argv[1], trees, update);
	}
	free_dir_trees(trees);
	if (no_mem)
	{
		fprintf(stderr, "Out of memory.\n");
		return 1;
	}
	return 0;
}